

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int lhConsumeCellkey(lhcell *pCell,_func_int_void_ptr_uint_void_ptr *xConsumer,void *pUserData,
                    int offt_only)

{
  lhash_kv_engine *plVar1;
  uchar *puVar2;
  ulong uVar3;
  bool bVar4;
  unqlite_page *puVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  unqlite_kv_io *puVar9;
  pgno pVar10;
  sxu32 sVar11;
  uchar *buf;
  unqlite_page *pOvfl;
  unqlite_page *local_50;
  int local_44;
  pgno *local_40;
  lhcell *local_38;
  
  pVar10 = pCell->iOvfl;
  local_44 = offt_only;
  if (pVar10 == 0) {
    iVar8 = (*xConsumer)(pCell->pPage->pRaw->zData + (ulong)pCell->iStart + 0x1a,pCell->nKey,
                         pUserData);
    iVar7 = -10;
    if (iVar8 == 0) {
      iVar7 = 0;
    }
  }
  else {
    sVar11 = pCell->nKey;
    iVar7 = 0;
    if (sVar11 != 0) {
      plVar1 = pCell->pPage->pHash;
      uVar6 = plVar1->iPageSize - 8;
      local_40 = &pCell->iDataPage;
      bVar4 = true;
      local_38 = pCell;
      while (iVar7 = (*plVar1->pIo->xGet)(plVar1->pIo->pHandle,pVar10,&local_50), puVar5 = local_50,
            iVar7 == 0) {
        puVar2 = local_50->zData;
        buf = puVar2 + 8;
        if (bVar4) {
          SyBigEndianUnpack64(buf,local_40);
          local_38->iDataOfft = *(ushort *)(puVar2 + 0x10) << 8 | *(ushort *)(puVar2 + 0x10) >> 8;
          if (local_44 != 0) {
            (*plVar1->pIo->xPageUnref)(puVar5);
            return 0;
          }
          buf = puVar2 + 0x12;
        }
        if (sVar11 < uVar6 || sVar11 - uVar6 == 0) {
          iVar7 = (*xConsumer)(buf,sVar11,pUserData);
          sVar11 = 0;
          if (iVar7 != 0) {
            puVar9 = plVar1->pIo;
            goto LAB_0011485f;
          }
        }
        else {
          iVar7 = (*xConsumer)(buf,uVar6,pUserData);
          sVar11 = sVar11 - uVar6;
          if (iVar7 != 0) {
            puVar9 = plVar1->pIo;
LAB_0011485f:
            (*puVar9->xPageUnref)(local_50);
            return -10;
          }
        }
        uVar3 = *(ulong *)local_50->zData;
        pVar10 = uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                 (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                 (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28 |
                 uVar3 << 0x38;
        (*plVar1->pIo->xPageUnref)(local_50);
        bVar4 = false;
        if (pVar10 == 0) {
          return 0;
        }
        if (sVar11 == 0) {
          return 0;
        }
      }
    }
  }
  return iVar7;
}

Assistant:

static int lhConsumeCellkey(
	lhcell *pCell, /* Target cell */
	int (*xConsumer)(const void *,unsigned int,void *), /* Consumer callback */
	void *pUserData, /* Last argument to xConsumer() */
	int offt_only
	)
{
	lhpage *pPage = pCell->pPage;
	const unsigned char *zRaw = pPage->pRaw->zData;
	const unsigned char *zPayload;
	int rc;
	/* Point to the payload area */
	zPayload = &zRaw[pCell->iStart];
	if( pCell->iOvfl == 0 ){
		/* Best scenario, consume the key directly without any overflow page */
		zPayload += L_HASH_CELL_SZ;
		rc = xConsumer((const void *)zPayload,pCell->nKey,pUserData);
		if( rc != UNQLITE_OK ){
			rc = UNQLITE_ABORT;
		}
	}else{
		lhash_kv_engine *pEngine = pPage->pHash;
		sxu32 nByte,nData = pCell->nKey;
		unqlite_page *pOvfl;
		int data_offset = 0;
		pgno iOvfl;
		/* Overflow page */
		iOvfl = pCell->iOvfl;
		/* Total usable bytes in an overflow page */
		nByte = L_HASH_OVERFLOW_SIZE(pEngine->iPageSize);
		for(;;){
			if( iOvfl == 0 || nData < 1 ){
				/* no more overflow page */
				break;
			}
			/* Point to the overflow page */
			rc = pEngine->pIo->xGet(pEngine->pIo->pHandle,iOvfl,&pOvfl);
			if( rc != UNQLITE_OK ){
				return rc;
			}
			zPayload = &pOvfl->zData[8];
			/* Point to the raw content */
			if( !data_offset ){
				/* Get the data page and offset */
				SyBigEndianUnpack64(zPayload,&pCell->iDataPage);
				zPayload += 8;
				SyBigEndianUnpack16(zPayload,&pCell->iDataOfft);
				zPayload += 2;
				if( offt_only ){
					/* Key too large, grab the data offset and return */
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_OK;
				}
				data_offset = 1;
			}
			/* Consume the key */
			if( nData <= nByte ){
				rc = xConsumer((const void *)zPayload,nData,pUserData);
				if( rc != UNQLITE_OK ){
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_ABORT;
				}
				nData = 0;
			}else{
				rc = xConsumer((const void *)zPayload,nByte,pUserData);
				if( rc != UNQLITE_OK ){
					pEngine->pIo->xPageUnref(pOvfl);
					return UNQLITE_ABORT;
				}
				nData -= nByte;
			}
			/* Next overflow page in the chain */
			SyBigEndianUnpack64(pOvfl->zData,&iOvfl);
			/* Unref the page */
			pEngine->pIo->xPageUnref(pOvfl);
		}
		rc = UNQLITE_OK;
	}
	return rc;
}